

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::Comments::set(Comments *this,CommentPlacement slot,String *comment)

{
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var1;
  long lVar2;
  
  if (2 < (int)slot) {
    return;
  }
  _Var1._M_head_impl =
       (this->ptr_)._M_t.
       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       .
       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl ==
      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> *
      )0x0) {
    _Var1._M_head_impl =
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)operator_new(0x60);
    (_Var1._M_head_impl)->_M_elems[0]._M_dataplus = 0;
    *(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 8) = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)(_Var1._M_head_impl)->_M_elems + 0x10))->_M_allocated_capacity = 0;
    *(undefined8 *)((long)(_Var1._M_head_impl)->_M_elems + 0x18) = 0;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
     ((long)(_Var1._M_head_impl)->_M_elems + 0x20))->_M_dataplus)._M_p = (pointer)0x0;
    *(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x28) = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)(_Var1._M_head_impl)->_M_elems + 0x30))->_M_allocated_capacity = 0;
    *(undefined8 *)((long)(_Var1._M_head_impl)->_M_elems + 0x38) = 0;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
     ((long)(_Var1._M_head_impl)->_M_elems + 0x40))->_M_dataplus)._M_p = (pointer)0x0;
    *(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x48) = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)(_Var1._M_head_impl)->_M_elems + 0x50))->_M_allocated_capacity = 0;
    *(undefined8 *)((long)(_Var1._M_head_impl)->_M_elems + 0x58) = 0;
    lVar2 = 0x10;
    do {
      *(long *)((long)(_Var1._M_head_impl)->_M_elems + lVar2 + -0x10) =
           (long)(_Var1._M_head_impl)->_M_elems + lVar2;
      *(undefined8 *)((long)(_Var1._M_head_impl)->_M_elems + lVar2 + -8) = 0;
      *(undefined1 *)((long)(_Var1._M_head_impl)->_M_elems + lVar2) = 0;
      lVar2 = lVar2 + 0x20;
    } while (lVar2 != 0x70);
    (this->ptr_)._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl = _Var1._M_head_impl;
  }
  std::__cxx11::string::operator=
            ((string *)((_Var1._M_head_impl)->_M_elems + slot),(string *)comment);
  return;
}

Assistant:

void Value::Comments::set(CommentPlacement slot, String comment) {
  if (slot >= CommentPlacement::numberOfCommentPlacement)
    return;
  if (!ptr_)
    ptr_ = std::unique_ptr<Array>(new Array());
  (*ptr_)[slot] = std::move(comment);
}